

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O1

void __thiscall slang::ast::Compilation::addGateType(Compilation *this,PrimitiveSymbol *prim)

{
  size_t *psVar1;
  group_type_pointer pgVar2;
  size_t __n;
  uint uVar3;
  uchar uVar4;
  uchar uVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  uchar uVar9;
  uchar uVar10;
  uchar uVar11;
  uchar uVar12;
  uchar uVar13;
  uchar uVar14;
  uchar uVar15;
  uchar uVar16;
  uchar uVar17;
  uchar uVar18;
  uchar uVar19;
  value_type *pvVar20;
  group_type_pointer pgVar21;
  uchar uVar22;
  uchar uVar23;
  uchar uVar24;
  uchar uVar25;
  uchar uVar26;
  uchar uVar27;
  uchar uVar28;
  uchar uVar29;
  uchar uVar30;
  uchar uVar31;
  uchar uVar32;
  uchar uVar33;
  uchar uVar34;
  uchar uVar35;
  uchar uVar36;
  uchar uVar37;
  int iVar38;
  uint uVar39;
  ulong uVar40;
  ulong uVar41;
  value_type *pvVar42;
  ulong uVar43;
  long lVar44;
  group_type_pointer pgVar45;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitiveSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PrimitiveSymbol_const*>>>
  *arrays_;
  basic_string_view<char,_std::char_traits<char>_> *sv;
  bool bVar46;
  undefined1 auVar47 [16];
  uchar uVar48;
  uchar uVar49;
  uchar uVar50;
  uchar uVar51;
  uchar uVar52;
  uchar uVar53;
  uchar uVar54;
  uchar uVar55;
  uchar uVar56;
  uchar uVar57;
  uchar uVar58;
  uchar uVar59;
  uchar uVar60;
  uchar uVar61;
  uchar uVar62;
  uchar uVar63;
  try_emplace_args_t local_c1;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitiveSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PrimitiveSymbol_const*>>>
  *local_c0;
  Compilation *local_b8;
  basic_string_view<char,_std::char_traits<char>_> *local_b0;
  uint64_t local_a8;
  PrimitiveSymbol *local_a0;
  ulong local_98;
  size_t local_90;
  ulong local_88;
  ulong local_80;
  value_type *elements;
  long local_70;
  group_type_pointer local_68;
  char *local_60;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  uchar uStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  uchar uStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  uchar uStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  uchar uStack_49;
  locator res;
  
  arrays_ = (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitiveSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PrimitiveSymbol_const*>>>
             *)&this->gateMap;
  sv = &(prim->super_Symbol).name;
  local_a0 = prim;
  local_a8 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                       ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)arrays_
                        ,sv);
  uVar43 = local_a8 >>
           ((byte)(this->gateMap).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  pgVar45 = (this->gateMap).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>_>_>
            .arrays.groups_;
  lVar44 = (local_a8 & 0xff) * 4;
  uVar48 = (&UNK_0051f39c)[lVar44];
  uVar49 = (&UNK_0051f39d)[lVar44];
  uVar50 = (&UNK_0051f39e)[lVar44];
  uVar51 = (&UNK_0051f39f)[lVar44];
  elements = (this->gateMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>_>_>
             .arrays.elements_;
  __n = (prim->super_Symbol).name._M_len;
  local_60 = (prim->super_Symbol).name._M_str;
  uVar40 = (ulong)((uint)local_a8 & 7);
  local_90 = (this->gateMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>_>_>
             .arrays.groups_size_mask;
  uVar41 = 0;
  uVar52 = uVar48;
  uVar53 = uVar49;
  uVar54 = uVar50;
  uVar55 = uVar51;
  uVar56 = uVar48;
  uVar57 = uVar49;
  uVar58 = uVar50;
  uVar59 = uVar51;
  uVar60 = uVar48;
  uVar61 = uVar49;
  uVar62 = uVar50;
  uVar63 = uVar51;
  local_80 = uVar43;
  do {
    pvVar20 = elements;
    local_70 = uVar43 * 0x10;
    pgVar2 = pgVar45 + uVar43;
    auVar47[0] = -(pgVar2->m[0].n == uVar48);
    auVar47[1] = -(pgVar2->m[1].n == uVar49);
    auVar47[2] = -(pgVar2->m[2].n == uVar50);
    auVar47[3] = -(pgVar2->m[3].n == uVar51);
    auVar47[4] = -(pgVar2->m[4].n == uVar52);
    auVar47[5] = -(pgVar2->m[5].n == uVar53);
    auVar47[6] = -(pgVar2->m[6].n == uVar54);
    auVar47[7] = -(pgVar2->m[7].n == uVar55);
    auVar47[8] = -(pgVar2->m[8].n == uVar56);
    auVar47[9] = -(pgVar2->m[9].n == uVar57);
    auVar47[10] = -(pgVar2->m[10].n == uVar58);
    auVar47[0xb] = -(pgVar2->m[0xb].n == uVar59);
    auVar47[0xc] = -(pgVar2->m[0xc].n == uVar60);
    auVar47[0xd] = -(pgVar2->m[0xd].n == uVar61);
    auVar47[0xe] = -(pgVar2->m[0xe].n == uVar62);
    auVar47[0xf] = -(pgVar2->m[0xf].n == uVar63);
    local_88 = uVar43;
    pgVar21 = pgVar45;
    uVar22 = uVar48;
    uVar23 = uVar49;
    uVar24 = uVar50;
    uVar25 = uVar51;
    uVar26 = uVar52;
    uVar27 = uVar53;
    uVar28 = uVar54;
    uVar29 = uVar55;
    uVar30 = uVar56;
    uVar31 = uVar57;
    uVar32 = uVar58;
    uVar33 = uVar59;
    uVar34 = uVar60;
    uVar35 = uVar61;
    uVar36 = uVar62;
    uVar37 = uVar63;
    pgVar2 = local_68;
    uVar4 = local_58;
    uVar5 = uStack_57;
    uVar6 = uStack_56;
    uVar7 = uStack_55;
    uVar8 = uStack_54;
    uVar9 = uStack_53;
    uVar10 = uStack_52;
    uVar11 = uStack_51;
    uVar12 = uStack_50;
    uVar13 = uStack_4f;
    uVar14 = uStack_4e;
    uVar15 = uStack_4d;
    uVar16 = uStack_4c;
    uVar17 = uStack_4b;
    uVar18 = uStack_4a;
    uVar19 = uStack_49;
    for (uVar39 = (uint)(ushort)((ushort)(SUB161(auVar47 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar47 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar47 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar47 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar47 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar47 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar47 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar47 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar47 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar47 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar47 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar47 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar47 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar47 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar47 >> 0x77,0) & 1) << 0xe); uStack_49 = uVar37,
        uStack_4a = uVar36, uStack_4b = uVar35, uStack_4c = uVar34, uStack_4d = uVar33,
        uStack_4e = uVar32, uStack_4f = uVar31, uStack_50 = uVar30, uStack_51 = uVar29,
        uStack_52 = uVar28, uStack_53 = uVar27, uStack_54 = uVar26, uStack_55 = uVar25,
        uStack_56 = uVar24, uStack_57 = uVar23, local_58 = uVar22, local_68 = pgVar21, uVar39 != 0;
        uVar39 = uVar39 - 1 & uVar39) {
      uVar3 = 0;
      if (uVar39 != 0) {
        for (; (uVar39 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
        }
      }
      bVar46 = __n == pvVar20[uVar43 * 0xf + (ulong)uVar3].first._M_len;
      pvVar42 = pvVar20 + uVar43 * 0xf + (ulong)uVar3;
      local_c0 = arrays_;
      local_b8 = this;
      local_b0 = sv;
      local_98 = uVar40;
      if (bVar46 && __n != 0) {
        iVar38 = bcmp(local_60,(pvVar42->first)._M_str,__n);
        bVar46 = iVar38 == 0;
        pgVar45 = local_68;
        uVar48 = local_58;
        uVar49 = uStack_57;
        uVar50 = uStack_56;
        uVar51 = uStack_55;
        uVar52 = uStack_54;
        uVar53 = uStack_53;
        uVar54 = uStack_52;
        uVar55 = uStack_51;
        uVar56 = uStack_50;
        uVar57 = uStack_4f;
        uVar58 = uStack_4e;
        uVar59 = uStack_4d;
        uVar60 = uStack_4c;
        uVar61 = uStack_4b;
        uVar62 = uStack_4a;
        uVar63 = uStack_49;
      }
      arrays_ = local_c0;
      sv = local_b0;
      this = local_b8;
      if (bVar46) goto LAB_00153b3c;
      uVar40 = local_98;
      pgVar21 = local_68;
      uVar22 = local_58;
      uVar23 = uStack_57;
      uVar24 = uStack_56;
      uVar25 = uStack_55;
      uVar26 = uStack_54;
      uVar27 = uStack_53;
      uVar28 = uStack_52;
      uVar29 = uStack_51;
      uVar30 = uStack_50;
      uVar31 = uStack_4f;
      uVar32 = uStack_4e;
      uVar33 = uStack_4d;
      uVar34 = uStack_4c;
      uVar35 = uStack_4b;
      uVar36 = uStack_4a;
      uVar37 = uStack_49;
      pgVar2 = local_68;
      uVar4 = local_58;
      uVar5 = uStack_57;
      uVar6 = uStack_56;
      uVar7 = uStack_55;
      uVar8 = uStack_54;
      uVar9 = uStack_53;
      uVar10 = uStack_52;
      uVar11 = uStack_51;
      uVar12 = uStack_50;
      uVar13 = uStack_4f;
      uVar14 = uStack_4e;
      uVar15 = uStack_4d;
      uVar16 = uStack_4c;
      uVar17 = uStack_4b;
      uVar18 = uStack_4a;
      uVar19 = uStack_49;
    }
    local_68 = pgVar2;
    local_58 = uVar4;
    uStack_57 = uVar5;
    uStack_56 = uVar6;
    uStack_55 = uVar7;
    uStack_54 = uVar8;
    uStack_53 = uVar9;
    uStack_52 = uVar10;
    uStack_51 = uVar11;
    uStack_50 = uVar12;
    uStack_4f = uVar13;
    uStack_4e = uVar14;
    uStack_4d = uVar15;
    uStack_4c = uVar16;
    uStack_4b = uVar17;
    uStack_4a = uVar18;
    uStack_49 = uVar19;
    if ((pgVar45->m[local_70 + 0xf].n &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[uVar40]) == 0) break;
    lVar44 = local_88 + uVar41;
    uVar41 = uVar41 + 1;
    uVar43 = lVar44 + 1U & local_90;
  } while (uVar41 <= local_90);
  pvVar42 = (value_type *)0x0;
LAB_00153b3c:
  if (pvVar42 == (value_type *)0x0) {
    if ((this->gateMap).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>_>_>
        .size_ctrl.size <
        (this->gateMap).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitiveSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PrimitiveSymbol_const*>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::PrimitiveSymbol_const*>
                (&res,arrays_,(arrays_type *)arrays_,local_80,local_a8,&local_c1,sv,&local_a0);
      psVar1 = &(this->gateMap).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitiveSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PrimitiveSymbol_const*>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::PrimitiveSymbol_const*>
                (&res,arrays_,local_a8,&local_c1,sv,&local_a0);
    }
  }
  return;
}

Assistant:

void Compilation::addGateType(const PrimitiveSymbol& prim) {
    SLANG_ASSERT(!isFrozen());
    SLANG_ASSERT(!prim.name.empty());
    gateMap.emplace(prim.name, &prim);
}